

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPrecisionTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::ShaderFloatPrecisionCase::iterate(ShaderFloatPrecisionCase *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  Float<unsigned_int,_8,_23,_127,_3U> FVar5;
  uint uVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  float *__s;
  long lVar8;
  IterateResult IVar9;
  ulong uVar10;
  deRandom *rnd;
  float *pfVar11;
  float *pfVar12;
  float __tmp;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  deUint64 u64;
  deUint16 indices [6];
  float in1Arr [4];
  float in0Arr [4];
  float position [16];
  Hex<8UL> local_428;
  long local_420;
  long local_418 [2];
  long local_408;
  double local_400;
  double local_3f8;
  ulong local_3f0;
  TestLog *local_3e8;
  deUint32 local_3dc;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> local_3d8;
  deRandom *local_3c0;
  ShaderFloatPrecisionCase *local_3b8;
  double local_3b0;
  undefined8 local_3a8;
  undefined4 local_3a0;
  float local_398 [4];
  undefined8 local_388;
  undefined8 uStack_380;
  undefined1 local_378 [8];
  _Alloc_hider local_370;
  undefined8 *local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  int local_350;
  VertexArrayPointer local_348 [2];
  ios_base local_300 [264];
  undefined1 local_1f8 [8];
  _func_int **local_1f0;
  long local_1e8;
  _func_int *local_1e0 [2];
  int local_1d0;
  ios_base local_180 [264];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 *local_48;
  undefined8 uStack_40;
  
  local_48 = &DAT_3f8000003f800000;
  uStack_40 = 0x3f80000000000000;
  local_58 = 0xbf8000003f800000;
  uStack_50 = 0x3f80000000000000;
  local_68 = 0x3f800000bf800000;
  uStack_60 = 0x3f80000000000000;
  local_78 = 0xbf800000bf800000;
  uStack_70 = 0x3f80000000000000;
  local_3a8 = 0x2000200010000;
  local_3a0 = 0x30001;
  local_388 = 0;
  uStack_380 = 0;
  local_398[0] = 0.0;
  local_398[1] = 0.0;
  local_398[2] = 0.0;
  local_398[3] = 0.0;
  local_3e8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_3d8.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_start = (VertexArrayBinding *)0x0;
  local_3d8.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = (float *)operator_new(0x4000);
  memset(__s,0,0x4000);
  dVar7 = (this->m_program->m_program).m_program;
  local_408 = CONCAT44(extraout_var,iVar3);
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x1680))(dVar7);
  (**(code **)(local_408 + 0x78))(0x8d40,this->m_framebuffer);
  local_428.value = (deUint64)local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"a_position","");
  local_1f8._0_4_ = 1;
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,local_428.value,local_420 + local_428.value);
  local_1d0 = 0;
  local_378._0_4_ = local_1f8._0_4_;
  local_370._M_p = (pointer)&local_360;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_370,local_1f0,local_1e8 + (long)local_1f0);
  local_350 = local_1d0;
  local_348[0].componentType = VTX_COMP_FLOAT;
  local_348[0].convert = VTX_COMP_CONVERT_NONE;
  local_348[0].numComponents = 4;
  local_348[0].numElements = 4;
  local_348[0].stride = 0;
  local_348[0].data = &local_78;
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,(ulong)(local_1e0[0] + 1));
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&local_3d8,(VertexArrayBinding *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_p != &local_360) {
    operator_delete(local_370._M_p,local_360._M_allocated_capacity + 1);
  }
  if ((long *)local_428.value != local_418) {
    operator_delete((void *)local_428.value,local_418[0] + 1);
  }
  local_428.value = (deUint64)local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"a_in0","");
  local_1f8._0_4_ = 1;
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,local_428.value,local_420 + local_428.value);
  local_1d0 = 0;
  local_378._0_4_ = local_1f8._0_4_;
  local_370._M_p = (pointer)&local_360;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_370,local_1f0,local_1e8 + (long)local_1f0);
  local_350 = local_1d0;
  local_348[0].componentType = VTX_COMP_FLOAT;
  local_348[0].convert = VTX_COMP_CONVERT_NONE;
  local_348[0].numComponents = 1;
  local_348[0].numElements = 4;
  local_348[0].stride = 0;
  local_348[0].data = &local_388;
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,(ulong)(local_1e0[0] + 1));
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&local_3d8,(VertexArrayBinding *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_p != &local_360) {
    operator_delete(local_370._M_p,local_360._M_allocated_capacity + 1);
  }
  if ((long *)local_428.value != local_418) {
    operator_delete((void *)local_428.value,local_418[0] + 1);
  }
  local_428.value = (deUint64)local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"a_in1","");
  local_1f8._0_4_ = 1;
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,local_428.value,local_420 + local_428.value);
  local_1d0 = 0;
  local_378._0_4_ = local_1f8._0_4_;
  local_370._M_p = (pointer)&local_360;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_370,local_1f0,local_1e8 + (long)local_1f0);
  local_350 = local_1d0;
  local_348[0].componentType = VTX_COMP_FLOAT;
  local_348[0].convert = VTX_COMP_CONVERT_NONE;
  local_348[0].numComponents = 1;
  local_348[0].numElements = 4;
  local_348[0].stride = 0;
  local_348[0].data = local_398;
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,(ulong)(local_1e0[0] + 1));
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&local_3d8,(VertexArrayBinding *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_p != &local_360) {
    operator_delete(local_370._M_p,local_360._M_allocated_capacity + 1);
  }
  if ((long *)local_428.value != local_418) {
    operator_delete((void *)local_428.value,local_418[0] + 1);
  }
  dVar4 = (**(code **)(local_408 + 0x800))();
  glu::checkError(dVar4,"After program setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
                  ,0x168);
  if (0 < this->m_numTestsPerIter) {
    rnd = &(this->m_rnd).m_rnd;
    local_3f0 = 0;
    local_3dc = dVar7;
    local_3c0 = rnd;
    local_3b8 = this;
    do {
      fVar15 = (this->m_rangeA).m_data[0];
      fVar16 = (this->m_rangeA).m_data[1];
      fVar13 = deRandom_getFloat(rnd);
      local_3f8 = (double)CONCAT44(local_3f8._4_4_,fVar13);
      local_400 = (double)CONCAT44(local_400._4_4_,(this->m_rangeB).m_data[0]);
      fVar13 = (this->m_rangeB).m_data[1];
      fVar14 = deRandom_getFloat(rnd);
      fVar15 = (fVar16 - fVar15) * local_3f8._0_4_ + fVar15;
      fVar16 = (fVar13 - local_400._0_4_) * fVar14 + local_400._0_4_;
      local_3f8 = (double)fVar15;
      local_400 = (double)fVar16;
      local_3b0 = (*this->m_evalFunc)(local_3f8,local_400);
      local_378 = (undefined1  [8])local_3b0;
      FVar5 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_long,11,52,1023,3u>
                        ((Float<unsigned_long,_11,_52,_1023,_3U> *)local_378);
      local_1f8 = (undefined1  [8])local_3e8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"iter ",5);
      std::ostream::operator<<((ostringstream *)&local_1f0,this->m_iterNdx);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,", test ",7);
      std::ostream::operator<<((ostringstream *)&local_1f0,(int)local_3f0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"in0 = ",6);
      std::ostream::_M_insert<double>(local_3f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0," / ",3);
      local_428.value = (deUint64)(uint)fVar15;
      tcu::Format::Hex<8UL>::toStream(&local_428,(ostream *)&local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,", in1 = ",8);
      std::ostream::_M_insert<double>(local_400);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0," / ",3);
      local_428.value = (deUint64)(uint)fVar16;
      tcu::Format::Hex<8UL>::toStream(&local_428,(ostream *)&local_1f0);
      local_378 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1f8,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"  reference = ",0xe)
      ;
      std::ostream::_M_insert<double>((double)(float)FVar5.m_value);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370," / ",3);
      local_428.value = (deUint64)FVar5.m_value;
      tcu::Format::Hex<8UL>::toStream(&local_428,(ostream *)&local_370);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_370);
      std::ios_base::~ios_base(local_300);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
      std::ios_base::~ios_base(local_180);
      lVar8 = 0;
      do {
        *(float *)((long)&local_388 + lVar8) = fVar15;
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0x10);
      lVar8 = 0;
      do {
        *(float *)((long)local_398 + lVar8) = fVar16;
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0x10);
      local_378 = (undefined1  [8])0x600000000;
      local_370._M_p._0_4_ = 1;
      local_368 = &local_3a8;
      glu::draw(((this->super_TestCase).m_context)->m_renderCtx,dVar7,
                (int)((ulong)((long)local_3d8.
                                    super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_3d8.
                                   super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333,
                local_3d8.
                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                ._M_impl.super__Vector_impl_data._M_start,(PrimitiveList *)local_378,
                (DrawUtilCallback *)0x0);
      lVar8 = local_408;
      (**(code **)(local_408 + 0x1220))(0,0,0x20,0x20,0x8d99,0x1405,__s);
      dVar4 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar4,"After render",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
                      ,0x17e);
      local_378 = (undefined1  [8])local_3e8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,"  result = ",0xb);
      std::ostream::_M_insert<double>((double)*__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370," / ",3);
      local_1f8 = (undefined1  [8])(ulong)(uint)*__s;
      tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_1f8,(ostream *)&local_370);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_370);
      std::ios_base::~ios_base(local_300);
      bVar2 = compare(this,fVar15,fVar16,local_3b0,*__s);
      rnd = local_3c0;
      if (bVar2) {
        fVar15 = *__s;
        bVar2 = true;
        uVar10 = 0;
        pfVar11 = __s;
        do {
          lVar8 = 0;
          pfVar12 = pfVar11;
          do {
            fVar16 = *pfVar12;
            if (fVar16 != fVar15) {
              local_378 = (undefined1  [8])local_3e8;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_370,"ERROR: Inconsistent results, got ",0x21);
              local_1f8 = (undefined1  [8])(ulong)(uint)fVar16;
              tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_1f8,(ostream *)&local_370);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370," at (",5);
              std::ostream::operator<<((ostringstream *)&local_370,(int)lVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,", ",2);
              std::ostream::operator<<((ostringstream *)&local_370,(int)uVar10);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,")",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_370);
              std::ios_base::~ios_base(local_300);
              bVar2 = false;
            }
            this = local_3b8;
            rnd = local_3c0;
            dVar7 = local_3dc;
            lVar8 = lVar8 + 1;
            pfVar12 = pfVar12 + 4;
          } while (lVar8 != 0x20);
          if (0x1e < uVar10) break;
          uVar10 = uVar10 + 1;
          pfVar11 = pfVar11 + 0x80;
        } while (bVar2);
        if (!bVar2) {
          tcu::TestContext::setTestResult
                    ((local_3b8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Inconsistent values in framebuffer");
        }
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Result comparison failed");
      }
    } while ((((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_testResult ==
              QP_TEST_RESULT_PASS) &&
            (uVar6 = (int)local_3f0 + 1, local_3f0 = (ulong)uVar6,
            (int)uVar6 < this->m_numTestsPerIter));
  }
  pcVar1 = *(code **)(local_408 + 0x78);
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[6])();
  (*pcVar1)(0x8d40,iVar3);
  dVar7 = (**(code **)(local_408 + 0x800))();
  glu::checkError(dVar7,"After iteration",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
                  ,0x1a9);
  iVar3 = this->m_iterNdx + 1;
  this->m_iterNdx = iVar3;
  IVar9 = STOP;
  if (iVar3 < this->m_numIters) {
    IVar9 = (IterateResult)
            (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_testResult ==
            QP_TEST_RESULT_PASS);
  }
  operator_delete(__s,0x4000);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
            (&local_3d8);
  return IVar9;
}

Assistant:

ShaderFloatPrecisionCase::IterateResult ShaderFloatPrecisionCase::iterate (void)
{
	// Constant data.
	const float position[] =
	{
		-1.0f, -1.0f, 0.0f, 1.0f,
		-1.0f,  1.0f, 0.0f, 1.0f,
		 1.0f, -1.0f, 0.0f, 1.0f,
		 1.0f,  1.0f, 0.0f, 1.0f
	};
	const deUint16					indices[]	= { 0, 1, 2, 2, 1, 3 };

	const int						numVertices	= 4;
	float							in0Arr[4]	= { 0.0f };
	float							in1Arr[4]	= { 0.0f };

	TestLog&						log			= m_testCtx.getLog();
	const glw::Functions&			gl			= m_context.getRenderContext().getFunctions();
	vector<glu::VertexArrayBinding>	vertexArrays;

	// Image read from GL.
	std::vector<float>	pixels		(FRAMEBUFFER_WIDTH*FRAMEBUFFER_HEIGHT*4);

	// \todo [2012-05-03 pyry] Could be cached.
	deUint32			prog		= m_program->getProgram();

	gl.useProgram(prog);
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);

	vertexArrays.push_back(glu::va::Float("a_position", 4, numVertices, 0, &position[0]));
	vertexArrays.push_back(glu::va::Float("a_in0", 1, numVertices, 0, &in0Arr[0]));
	vertexArrays.push_back(glu::va::Float("a_in1", 1, numVertices, 0, &in1Arr[0]));

	GLU_EXPECT_NO_ERROR(gl.getError(), "After program setup");

	// Compute values and reference.
	for (int testNdx = 0; testNdx < m_numTestsPerIter; testNdx++)
	{
		const float		in0		= m_rnd.getFloat(m_rangeA.x(), m_rangeA.y());
		const float		in1		= m_rnd.getFloat(m_rangeB.x(), m_rangeB.y());
		const double	refD	= m_evalFunc((double)in0, (double)in1);
		const float		refF	= tcu::Float64(refD).asFloat(); // Uses RTE rounding mode.

		log << TestLog::Message << "iter " << m_iterNdx << ", test " << testNdx << ": "
								<< "in0 = " << in0 << " / " << tcu::toHex(tcu::Float32(in0).bits())
								<< ", in1 = " << in1 << " / " << tcu::toHex(tcu::Float32(in1).bits())
			<< TestLog::EndMessage
			<< TestLog::Message << "  reference = " << refF << " / " << tcu::toHex(tcu::Float32(refF).bits()) << TestLog::EndMessage;

		std::fill(&in0Arr[0], &in0Arr[0] + DE_LENGTH_OF_ARRAY(in0Arr), in0);
		std::fill(&in1Arr[0], &in1Arr[0] + DE_LENGTH_OF_ARRAY(in1Arr), in1);

		glu::draw(m_context.getRenderContext(), prog, (int)vertexArrays.size(), &vertexArrays[0],
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		gl.readPixels(0, 0, FRAMEBUFFER_WIDTH, FRAMEBUFFER_HEIGHT, GL_RGBA_INTEGER, GL_UNSIGNED_INT, &pixels[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "After render");

		log << TestLog::Message << "  result = " << pixels[0] << " / " << tcu::toHex(tcu::Float32(pixels[0]).bits()) << TestLog::EndMessage;

		// Verify results
		{
			const bool firstPixelOk = compare(in0, in1, refD, pixels[0]);

			if (firstPixelOk)
			{
				// Check that rest of pixels match to first one.
				const deUint32	firstPixelBits	= tcu::Float32(pixels[0]).bits();
				bool			allPixelsOk		= true;

				for (int y = 0; y < FRAMEBUFFER_HEIGHT; y++)
				{
					for (int x = 0; x < FRAMEBUFFER_WIDTH; x++)
					{
						const deUint32 pixelBits = tcu::Float32(pixels[(y*FRAMEBUFFER_WIDTH + x)*4]).bits();

						if (pixelBits != firstPixelBits)
						{
							log << TestLog::Message << "ERROR: Inconsistent results, got " << tcu::toHex(pixelBits) << " at (" << x << ", " << y << ")" << TestLog::EndMessage;
							allPixelsOk = false;
						}
					}

					if (!allPixelsOk)
						break;
				}

				if (!allPixelsOk)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Inconsistent values in framebuffer");
			}
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result comparison failed");
		}

		if (m_testCtx.getTestResult() != QP_TEST_RESULT_PASS)
			break;
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
	GLU_EXPECT_NO_ERROR(gl.getError(), "After iteration");

	m_iterNdx += 1;
	return (m_iterNdx < m_numIters && m_testCtx.getTestResult() == QP_TEST_RESULT_PASS) ? CONTINUE : STOP;
}